

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JP2K.cpp
# Opt level: O0

void __thiscall ASDCP::JP2K::Accessor::COM::Dump(COM *this,FILE *stream)

{
  undefined8 __stream;
  bool bVar1;
  ui32_t uVar2;
  undefined8 uVar3;
  byte_t *pbVar4;
  string local_38 [8];
  string tmp_str;
  FILE *stream_local;
  COM *this_local;
  
  tmp_str.field_2._8_8_ = stream;
  if (stream == (FILE *)0x0) {
    tmp_str.field_2._8_8_ = _stderr;
  }
  bVar1 = IsText(this);
  if (bVar1) {
    std::__cxx11::string::string(local_38);
    pbVar4 = CommentData(this);
    CommentSize(this);
    std::__cxx11::string::assign((char *)local_38,(ulong)pbVar4);
    __stream = tmp_str.field_2._8_8_;
    uVar3 = std::__cxx11::string::c_str();
    fprintf((FILE *)__stream,"COM:%s\n",uVar3);
    std::__cxx11::string::~string(local_38);
  }
  else {
    fprintf((FILE *)tmp_str.field_2._8_8_,"COM:\n");
    pbVar4 = CommentData(this);
    uVar2 = CommentSize(this);
    Kumu::hexdump(pbVar4,uVar2,(_IO_FILE *)tmp_str.field_2._8_8_);
  }
  return;
}

Assistant:

void
ASDCP::JP2K::Accessor::COM::Dump(FILE* stream) const
{
  if ( stream == 0 )
    stream = stderr;

  if ( IsText() )
    {
      std::string tmp_str;
      tmp_str.assign((char*)CommentData(), CommentSize());
      fprintf(stream, "COM:%s\n", tmp_str.c_str());
    }
  else
    {
      fprintf(stream, "COM:\n");
      Kumu::hexdump(CommentData(), CommentSize(), stream);
    }
}